

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O1

Sampler * vk::mapVkSampler(Sampler *__return_storage_ptr__,VkSamplerCreateInfo *samplerCreateInfo)

{
  VkSamplerMipmapMode VVar1;
  VkFilter VVar2;
  VkBool32 VVar3;
  WrapMode WVar4;
  InternalError *this;
  WrapMode WVar5;
  WrapMode WVar6;
  CompareMode CVar7;
  FilterMode FVar8;
  FilterMode FVar9;
  VkFilter VVar10;
  deUint32 dVar11;
  deUint32 dVar12;
  deUint32 dVar13;
  deUint32 dVar14;
  
  WVar4 = WRAPMODE_LAST;
  WVar5 = WRAPMODE_LAST;
  if ((ulong)samplerCreateInfo->addressModeU < 5) {
    WVar5 = *(WrapMode *)(&DAT_00bae168 + (ulong)samplerCreateInfo->addressModeU * 4);
  }
  if ((ulong)samplerCreateInfo->addressModeV < 5) {
    WVar4 = *(WrapMode *)(&DAT_00bae168 + (ulong)samplerCreateInfo->addressModeV * 4);
  }
  WVar6 = WRAPMODE_LAST;
  if ((ulong)samplerCreateInfo->addressModeW < 5) {
    WVar6 = *(WrapMode *)(&DAT_00bae168 + (ulong)samplerCreateInfo->addressModeW * 4);
  }
  VVar1 = samplerCreateInfo->mipmapMode;
  if (samplerCreateInfo->minFilter == VK_FILTER_NEAREST) {
    FVar9 = (uint)(VVar1 != VK_SAMPLER_MIPMAP_MODE_NEAREST) * 4 + NEAREST_MIPMAP_NEAREST;
    FVar8 = NEAREST_MIPMAP_LINEAR;
  }
  else {
    FVar8 = FILTERMODE_LAST;
    if (samplerCreateInfo->minFilter != VK_FILTER_LINEAR) goto LAB_00a34672;
    FVar9 = (uint)(VVar1 != VK_SAMPLER_MIPMAP_MODE_NEAREST) * 2 + LINEAR_MIPMAP_NEAREST;
    FVar8 = LINEAR_MIPMAP_LINEAR;
  }
  if (VVar1 != VK_SAMPLER_MIPMAP_MODE_LINEAR) {
    FVar8 = FVar9;
  }
LAB_00a34672:
  VVar2 = samplerCreateInfo->magFilter;
  VVar10 = 6;
  if (VVar2 == VK_FILTER_NEAREST) {
    VVar10 = VVar2;
  }
  VVar3 = samplerCreateInfo->unnormalizedCoordinates;
  if (VVar2 == VK_FILTER_LINEAR) {
    VVar10 = VVar2;
  }
  CVar7 = COMPAREMODE_NONE;
  if (samplerCreateInfo->compareEnable != 0) {
    CVar7 = COMPAREMODE_LAST;
    if ((ulong)samplerCreateInfo->compareOp < 8) {
      CVar7 = *(CompareMode *)(&DAT_00bae28c + (ulong)samplerCreateInfo->compareOp * 4);
    }
  }
  __return_storage_ptr__->wrapS = WVar5;
  __return_storage_ptr__->wrapT = WVar4;
  __return_storage_ptr__->wrapR = WVar6;
  __return_storage_ptr__->minFilter = FVar8;
  __return_storage_ptr__->magFilter = VVar10;
  __return_storage_ptr__->lodThreshold = 0.0;
  __return_storage_ptr__->normalizedCoords = VVar3 == 0;
  __return_storage_ptr__->compare = CVar7;
  *(undefined8 *)&__return_storage_ptr__->compareChannel = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->borderColor).v + 4) = 0;
  (__return_storage_ptr__->borderColor).v.uData[3] = 0;
  __return_storage_ptr__->seamlessCubeMap = true;
  __return_storage_ptr__->depthStencilMode = MODE_DEPTH;
  if (samplerCreateInfo->anisotropyEnable == 0) {
    if (samplerCreateInfo->borderColor < VK_BORDER_COLOR_LAST) {
      switch(samplerCreateInfo->borderColor) {
      default:
        *(undefined8 *)&(__return_storage_ptr__->borderColor).v = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->borderColor).v + 8) = 0;
        return __return_storage_ptr__;
      case VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK:
        dVar11 = 0;
        dVar12 = 0;
        dVar13 = 0;
        dVar14 = 0x3f800000;
        break;
      case VK_BORDER_COLOR_INT_OPAQUE_BLACK:
        dVar11 = 0;
        dVar12 = 0;
        dVar13 = 0;
        dVar14 = 1;
        break;
      case VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE:
        dVar11 = 0x3f800000;
        dVar12 = 0x3f800000;
        dVar13 = 0x3f800000;
        dVar14 = 0x3f800000;
        break;
      case VK_BORDER_COLOR_INT_OPAQUE_WHITE:
        dVar11 = 1;
        dVar12 = 1;
        dVar13 = 1;
        dVar14 = 1;
      }
      (__return_storage_ptr__->borderColor).v.uData[0] = dVar11;
      (__return_storage_ptr__->borderColor).v.uData[1] = dVar12;
      (__return_storage_ptr__->borderColor).v.uData[2] = dVar13;
      (__return_storage_ptr__->borderColor).v.uData[3] = dVar14;
    }
    return __return_storage_ptr__;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this,"Anisotropic filtering is not supported by tcu::Sampler",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkImageUtil.cpp"
             ,0x377);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::Sampler mapVkSampler (const VkSamplerCreateInfo& samplerCreateInfo)
{
	// \note minLod & maxLod are not supported by tcu::Sampler. LOD must be clamped
	//       before passing it to tcu::Texture*::sample*()

	tcu::Sampler sampler(mapVkSamplerAddressMode(samplerCreateInfo.addressModeU),
						 mapVkSamplerAddressMode(samplerCreateInfo.addressModeV),
						 mapVkSamplerAddressMode(samplerCreateInfo.addressModeW),
						 mapVkMinTexFilter(samplerCreateInfo.minFilter, samplerCreateInfo.mipmapMode),
						 mapVkMagTexFilter(samplerCreateInfo.magFilter),
						 0.0f,
						 !samplerCreateInfo.unnormalizedCoordinates,
						 samplerCreateInfo.compareEnable ? mapVkSamplerCompareOp(samplerCreateInfo.compareOp)
														 : tcu::Sampler::COMPAREMODE_NONE,
						 0,
						 tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f),
						 true);

	if (samplerCreateInfo.anisotropyEnable)
		TCU_THROW(InternalError, "Anisotropic filtering is not supported by tcu::Sampler");

	switch (samplerCreateInfo.borderColor)
	{
		case VK_BORDER_COLOR_INT_OPAQUE_BLACK:
			sampler.borderColor = tcu::UVec4(0,0,0,1);
			break;
		case VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK:
			sampler.borderColor = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
			break;
		case VK_BORDER_COLOR_INT_OPAQUE_WHITE:
			sampler.borderColor = tcu::UVec4(1, 1, 1, 1);
			break;
		case VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE:
			sampler.borderColor = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);
			break;
		case VK_BORDER_COLOR_INT_TRANSPARENT_BLACK:
			sampler.borderColor = tcu::UVec4(0,0,0,0);
			break;
		case VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK:
			sampler.borderColor = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	return sampler;
}